

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall CodeGenGenericContext::InvalidateState(CodeGenGenericContext *this)

{
  uint local_1c;
  uint local_18;
  uint i_2;
  uint i_1;
  uint i;
  CodeGenGenericContext *this_local;
  
  for (i_2 = 0; i_2 < 0x11; i_2 = i_2 + 1) {
    this->genReg[i_2].type = argNone;
  }
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    this->xmmReg[local_18].type = argNone;
  }
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    this->memCache[local_1c].address.type = argNone;
    this->memCache[local_1c].value.type = argNone;
  }
  this->memCacheFreeSlotCount = 0;
  this->memCacheNextSlot = 0;
  this->currFreeXmmReg = rXMM0;
  this->currFreeReg = 0;
  return;
}

Assistant:

void CodeGenGenericContext::InvalidateState()
{
#if defined(NULLC_OPTIMIZE_X86)
	for(unsigned i = 0; i < rRegCount; i++)
		genReg[i].type = x86Argument::argNone;

	for(unsigned i = 0; i < rXmmRegCount; i++)
		xmmReg[i].type = x86Argument::argNone;

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		memCache[i].address.type = x86Argument::argNone;
		memCache[i].value.type = x86Argument::argNone;
	}

	memCacheFreeSlotCount = 0;
	memCacheNextSlot = 0;
#endif

	currFreeXmmReg = rXMM0;
	currFreeReg = 0;
}